

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandIso(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pNtk;
  Aig_Man_t *pAig;
  Aig_Man_t *pMan;
  Abc_Ntk_t *pNtk_00;
  char *pcVar2;
  uint fVerbose;
  Vec_Ptr_t *vPosEquivs;
  
  vPosEquivs = (Vec_Ptr_t *)0x0;
  fVerbose = 0;
  Extra_UtilGetoptReset();
  while (iVar1 = Extra_UtilGetopt(argc,argv,"vh"), iVar1 == 0x76) {
    fVerbose = fVerbose ^ 1;
  }
  if (iVar1 == -1) {
    pNtk = Abc_FrameReadNtk(pAbc);
    if (pNtk == (Abc_Ntk_t *)0x0) {
      pcVar2 = "Main AIG: There is no current network.\n";
    }
    else if (pNtk->ntkType == ABC_NTK_STRASH) {
      if (pNtk->vPos->nSize != 1) {
        pAig = Abc_NtkToDar(pNtk,0,1);
        pMan = Saig_ManIsoReduce(pAig,&vPosEquivs,fVerbose);
        pNtk_00 = Abc_NtkFromAigPhase(pMan);
        pcVar2 = Extra_UtilStrsav(pNtk->pName);
        pNtk_00->pName = pcVar2;
        Aig_ManStop(pMan);
        Aig_ManStop(pAig);
        Abc_FrameReplacePoEquivs(pAbc,&vPosEquivs);
        Abc_FrameReplaceCurrentNetwork(pAbc,pNtk_00);
        return 0;
      }
      pcVar2 = "Current AIG has only one PO. Transformation is not performed.\n";
    }
    else {
      pcVar2 = "Main AIG: The current network is not an AIG.\n";
    }
    iVar1 = 0;
    Abc_Print(1,pcVar2);
  }
  else {
    if (iVar1 != 0x68) {
      Abc_Print(-2,"Unknown switch.\n");
    }
    Abc_Print(-2,"usage: iso [-vh]\n");
    Abc_Print(-2,"\t         removes POs with isomorphic sequential COI\n");
    pcVar2 = "yes";
    if (fVerbose == 0) {
      pcVar2 = "no";
    }
    Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar2);
    Abc_Print(-2,"\t-h     : print the command usage\n");
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int Abc_CommandIso( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkNew = NULL;
    Aig_Man_t * pAig, * pTemp;
    Vec_Ptr_t * vPosEquivs = NULL;
    int c, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "vh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            Abc_Print( -2, "Unknown switch.\n");
            goto usage;
        }
    }

    // check the main AIG
    pNtk = Abc_FrameReadNtk(pAbc);
    if ( pNtk == NULL )
    {
        Abc_Print( 1, "Main AIG: There is no current network.\n");
        return 0;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( 1, "Main AIG: The current network is not an AIG.\n");
        return 0;
    }
    if ( Abc_NtkPoNum(pNtk) == 1 )
    {
        Abc_Print( 1, "Current AIG has only one PO. Transformation is not performed.\n");
        return 0;
    }

    // transform
    pAig = Abc_NtkToDar( pNtk, 0, 1 );
    pTemp = Saig_ManIsoReduce( pAig, &vPosEquivs, fVerbose );
    pNtkNew = Abc_NtkFromAigPhase( pTemp );
    pNtkNew->pName = Extra_UtilStrsav(pNtk->pName);
    Aig_ManStop( pTemp );
    Aig_ManStop( pAig );

    // update the internal storage of PO equivalences
    Abc_FrameReplacePoEquivs( pAbc, &vPosEquivs );

    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkNew );
    return 0;

usage:
    Abc_Print( -2, "usage: iso [-vh]\n" );
    Abc_Print( -2, "\t         removes POs with isomorphic sequential COI\n" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}